

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_opcode.h
# Opt level: O2

void __thiscall b_submesh::b_submesh(b_submesh *this,uint32_t _tag,uint16_t _sector)

{
  b_model_instance::b_model_instance(&this->super_b_model_instance,_tag,_sector);
  this->group = 0xffffffff;
  Opcode::MeshInterface::MeshInterface(&this->opc_mesh);
  Opcode::Model::Model(&this->opc_model);
  return;
}

Assistant:

inline b_submesh::b_submesh(uint32_t _tag, uint16_t _sector):
	b_model_instance(_tag, _sector), group(BAD_IDX) {}